

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_png.cpp
# Opt level: O1

void __thiscall PNGHandle::~PNGHandle(PNGHandle *this)

{
  char *pcVar1;
  ulong uVar2;
  
  if ((this->TextChunks).Count != 0) {
    uVar2 = 0;
    do {
      pcVar1 = (this->TextChunks).Array[uVar2];
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->TextChunks).Count);
  }
  if ((this->bDeleteFilePtr != false) && (this->File != (FileReader *)0x0)) {
    (*(this->File->super_FileReaderBase)._vptr_FileReaderBase[1])();
  }
  TArray<char_*,_char_*>::~TArray(&this->TextChunks);
  TArray<PNGHandle::Chunk,_PNGHandle::Chunk>::~TArray(&this->Chunks);
  return;
}

Assistant:

PNGHandle::~PNGHandle ()
{
	for (unsigned int i = 0; i < TextChunks.Size(); ++i)
	{
		delete[] TextChunks[i];
	}
	if (bDeleteFilePtr)
	{
		delete File;
	}
}